

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O3

int anon_unknown.dwarf_15577::usage(ostream *os,char *name,Flags *options)

{
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"usage: ",7);
  if (name == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(os,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,
             " <[ exe ] <PID | core> >+\n\nprint a stack trace of PID or core. If specified, assume image was created from\n execing `exe`, otherwise, the executable is inferred from the process or core\n\navailable options:\n"
             ,0xce);
  poVar2 = (ostream *)::pstack::Flags::dump((ostream *)options);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return (int)poVar2;
}

Assistant:

int
usage(std::ostream &os, const char *name, const Flags &options)
{
     os <<
"usage: " << name << " <[ exe ] <PID | core> >+\n"
"\n"
"print a stack trace of PID or core. If specified, assume image was created from\n"
" execing `exe`, otherwise, the executable is inferred from the process or core\n"
"\n"
"available options:\n" << options <<  "\n";
     return EX_USAGE;
}